

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

int __thiscall PFloat::GetValueInt(PFloat *this,void *addr)

{
  double extraout_XMM0_Qa;
  
  (*(this->super_PBasicType).super_PType.super_PTypeBase.super_DObject._vptr_DObject[0x12])();
  return SUB84(extraout_XMM0_Qa + *(double *)(&DAT_005f0420 + (ulong)(extraout_XMM0_Qa < 0.0) * 8) +
               6755399441055744.0,0);
}

Assistant:

int PFloat::GetValueInt(void *addr) const
{
	return xs_ToInt(GetValueFloat(addr));
}